

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_ce22::BlockCopy<unsigned_char>::Run
          (BlockCopy<unsigned_char> *this,istream *input_stream)

{
  uint write_size;
  int iVar1;
  bool bVar2;
  char *__nptr;
  pointer puVar3;
  bool bVar4;
  uint write_size_00;
  uint uVar5;
  istream *piVar6;
  int *piVar7;
  undefined8 uVar8;
  ostream *poVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pad_data;
  uchar local_ca;
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  istream *local_98;
  ulong local_90;
  ulong local_88;
  pointer local_80;
  pointer local_78;
  long local_70;
  char *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar11 = this->input_end_number_ - this->input_start_number_;
  write_size = this->output_start_number_;
  uVar12 = (ulong)write_size;
  write_size_00 = (~uVar11 - write_size) + this->output_block_length_;
  uVar5 = write_size_00;
  if ((int)write_size_00 < (int)write_size) {
    uVar5 = write_size;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,(long)(int)uVar5,&this->pad_value_,(allocator_type *)&local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,(long)this->input_block_length_,(allocator_type *)&local_b8);
  if (this->is_ascii_ == false) {
    do {
      bVar4 = sptk::ReadStream<unsigned_char>
                        (false,0,0,this->input_block_length_,&local_60,input_stream,(int *)0x0);
      if (!bVar4) goto LAB_00107577;
    } while (((((int)write_size < 1) ||
              (bVar4 = sptk::WriteStream<unsigned_char>
                                 (0,write_size,&local_48,(ostream *)&std::cout,(int *)0x0), bVar4))
             && (bVar4 = sptk::WriteStream<unsigned_char>
                                   (this->input_start_number_,uVar11 + 1,&local_60,
                                    (ostream *)&std::cout,(int *)0x0), bVar4)) &&
            (((int)write_size_00 < 1 ||
             (bVar4 = sptk::WriteStream<unsigned_char>
                                (0,write_size_00,&local_48,(ostream *)&std::cout,(int *)0x0), bVar4)
             )));
  }
  else {
    local_80 = local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_70 = (long)(int)write_size_00;
    local_90 = 0;
    local_78 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_98 = input_stream;
    local_88 = uVar12;
    while ((local_90 & 1) == 0) {
      if (this->input_block_length_ < 1) {
        bVar4 = true;
      }
      else {
        lVar13 = 0;
        do {
          local_b8 = local_a8;
          local_b0 = 0;
          local_a8[0] = '\0';
          piVar6 = std::operator>>(input_stream,(string *)&local_b8);
          __nptr = local_b8;
          bVar4 = false;
          if (local_b0 == 0) {
            bVar4 = true;
            local_90 = CONCAT71((int7)((ulong)piVar6 >> 8),1);
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if ((this->input_start_number_ <= lVar13) && (lVar13 <= this->input_end_number_)) {
              piVar7 = __errno_location();
              iVar1 = *piVar7;
              *piVar7 = 0;
              strtold(__nptr,&local_68);
              if (local_68 == __nptr) {
                uVar8 = std::__throw_invalid_argument("stold");
LAB_001075b1:
                if (local_b8 != local_a8) {
                  operator_delete(local_b8);
                }
                if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_60.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                _Unwind_Resume(uVar8);
              }
              if (*piVar7 == 0) {
                *piVar7 = iVar1;
              }
              else if (*piVar7 == 0x22) {
                uVar8 = std::__throw_out_of_range("stold");
                goto LAB_001075b1;
              }
              local_ca = (uchar)(short)ROUND(in_ST0);
              local_80[lVar13] = local_ca;
              input_stream = local_98;
              in_ST0 = in_ST1;
              in_ST1 = in_ST2;
              in_ST2 = in_ST3;
              in_ST3 = in_ST4;
              in_ST4 = in_ST5;
              in_ST5 = in_ST6;
              in_ST6 = in_ST7;
            }
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
          }
          uVar12 = local_88;
          if (!bVar2) goto LAB_001073b3;
          lVar13 = lVar13 + 1;
        } while (lVar13 < this->input_block_length_);
        bVar4 = true;
      }
LAB_001073b3:
      puVar3 = local_78;
      if (!bVar4) goto LAB_0010756e;
      if ((local_90 & 1) != 0) break;
      if (0 < (int)uVar12) {
        uVar10 = 0;
        do {
          local_b8 = (char *)CONCAT71(local_b8._1_7_,puVar3[uVar10]);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_b8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      if (this->input_start_number_ <= this->input_end_number_) {
        lVar13 = (long)this->input_start_number_ + -1;
        do {
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18))
               = 0x13;
          local_b8 = (char *)CONCAT71(local_b8._1_7_,local_80[lVar13 + 1]);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_b8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          lVar13 = lVar13 + 1;
        } while (lVar13 < this->input_end_number_);
      }
      if (0 < (int)write_size_00) {
        lVar13 = 0;
        do {
          local_b8 = (char *)CONCAT71(local_b8._1_7_,puVar3[lVar13]);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_b8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          lVar13 = lVar13 + 1;
        } while (lVar13 < local_70);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
    }
    bVar4 = false;
LAB_0010756e:
    if (!bVar4) {
LAB_00107577:
      bVar4 = true;
      goto LAB_00107579;
    }
  }
  bVar4 = false;
LAB_00107579:
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    const int copy_length(input_end_number_ - input_start_number_ + 1);
    const int left_pad_length(output_start_number_);
    const int right_pad_length(output_block_length_ - output_start_number_ -
                               copy_length);

    std::vector<T> pad_data(std::max(left_pad_length, right_pad_length),
                            pad_value_);
    std::vector<T> input_data(input_block_length_);

    if (is_ascii_) {
      T* pads(&(pad_data[0]));
      T* inputs(&(input_data[0]));
      bool halt(false);
      while (!halt) {
        // Read data.
        for (int i(0); i < input_block_length_; ++i) {
          std::string word;
          *input_stream >> word;
          if (word.empty()) {
            halt = true;
            break;
          }
          if (input_start_number_ <= i && i <= input_end_number_) {
            try {
              inputs[i] = static_cast<T>(std::stold(word));
            } catch (std::invalid_argument&) {
              return false;
            }
          }
        }
        if (halt) break;

        // Write data.
        for (int i(0); i < left_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        for (int i(input_start_number_); i <= input_end_number_; ++i) {
          std::cout << std::setprecision(
                           std::numeric_limits<long double>::digits10 + 1)
                    << inputs[i] << " ";
        }
        for (int i(0); i < right_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        std::cout << std::endl;
      }
    } else {
      while (sptk::ReadStream(false, 0, 0, input_block_length_, &input_data,
                              input_stream, NULL)) {
        if (0 < left_pad_length &&
            !sptk::WriteStream(0, left_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
        if (!sptk::WriteStream(input_start_number_, copy_length, input_data,
                               &std::cout, NULL)) {
          return false;
        }
        if (0 < right_pad_length &&
            !sptk::WriteStream(0, right_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
      }
    }

    return true;
  }